

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmc_impl.cpp
# Opt level: O0

string * __thiscall
ui::(anonymous_namespace)::Format_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,float value,sizeApprox unit)

{
  ostream *poVar1;
  allocator<char> local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined4 local_1d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  int local_1b0;
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [376];
  uint local_18;
  float local_14;
  sizeApprox unit_local;
  float value_local;
  
  local_18 = (uint)this;
  local_14 = value;
  _unit_local = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,std::fixed);
  local_1b0 = (int)std::setprecision(2);
  poVar1 = std::operator<<(poVar1,(_Setprecision)local_1b0);
  std::ostream::operator<<(poVar1,local_14 / (float)local_18);
  if (local_18 == 0x400) {
    std::__cxx11::stringstream::str();
    std::operator+(__return_storage_ptr__,&local_1d0," KB");
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  else if (local_18 == 0x100000) {
    std::__cxx11::stringstream::str();
    std::operator+(__return_storage_ptr__,&local_1f8," MB");
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  else if (local_18 == 0x40000000) {
    std::__cxx11::stringstream::str();
    std::operator+(__return_storage_ptr__,&local_218," GB");
    std::__cxx11::string::~string((string *)&local_218);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_219);
    std::allocator<char>::~allocator(&local_219);
  }
  local_1d4 = 1;
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string Format(float value, sizeApprox unit) {
  std::stringstream ss;
  ss << std::fixed << std::setprecision(2) << (value / float(unit));

  switch (unit) {
    case KB:
      return ss.str() + " KB";
    case MB:
      return ss.str() + " MB";
    case GB:
      return ss.str() + " GB";
    default:
      return "";
  }
}